

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall google::protobuf::internal::ExtensionSet::IsInitialized(ExtensionSet *this)

{
  byte bVar1;
  char cVar2;
  LogMessage *other;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  LogFinisher local_69;
  LogMessage local_68;
  
  p_Var4 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      bVar1 = *(byte *)&p_Var4[1]._M_left;
      if ((byte)(bVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x35);
        other = LogMessage::operator<<
                          (&local_68,
                           "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_69,other);
        LogMessage::~LogMessage(&local_68);
      }
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
        if (*(char *)((long)&p_Var4[1]._M_left + 1) == '\x01') {
          p_Var3 = p_Var4[1]._M_parent;
          if (0 < *(int *)&p_Var3->_M_parent) {
            lVar5 = 0;
            do {
              cVar2 = (**(code **)(**(long **)(*(long *)p_Var3 + lVar5 * 8) + 0x28))();
              if (cVar2 == '\0') {
                return false;
              }
              lVar5 = lVar5 + 1;
              p_Var3 = p_Var4[1]._M_parent;
            } while (lVar5 < *(int *)&p_Var3->_M_parent);
          }
        }
        else if (((ulong)p_Var4[1]._M_left & 0x10000) == 0) {
          if (((ulong)p_Var4[1]._M_left & 0x100000) == 0) {
            cVar2 = (**(code **)(*(long *)p_Var4[1]._M_parent + 0x28))();
          }
          else {
            cVar2 = (**(code **)(*(long *)p_Var4[1]._M_parent + 0x38))();
          }
          if (cVar2 == '\0') {
            return false;
          }
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  return true;
}

Assistant:

bool ExtensionSet::IsInitialized() const {
  // Extensions are never required.  However, we need to check that all
  // embedded messages are initialized.
  for (map<int, Extension>::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    const Extension& extension = iter->second;
    if (cpp_type(extension.type) == WireFormatLite::CPPTYPE_MESSAGE) {
      if (extension.is_repeated) {
        for (int i = 0; i < extension.repeated_message_value->size(); i++) {
          if (!extension.repeated_message_value->Get(i).IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!extension.is_cleared) {
          if (extension.is_lazy) {
            if (!extension.lazymessage_value->IsInitialized()) return false;
          } else {
            if (!extension.message_value->IsInitialized()) return false;
          }
        }
      }
    }
  }

  return true;
}